

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaft.cpp
# Opt level: O3

void __thiscall chrono::ChShaft::ChShaft(ChShaft *this,ChShaft *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaft_00b21f60;
  (this->super_ChLoadable)._vptr_ChLoadable = (_func_int **)&PTR__ChShaft_00b221a8;
  ChVariables::ChVariables(&(this->variables).super_ChVariables,1);
  (this->variables).super_ChVariables._vptr_ChVariables = (_func_int **)&PTR__ChVariables_00b3bb90;
  (this->variables).m_shaft = (ChShaft *)0x0;
  (this->variables).m_inertia = 1.0;
  (this->variables).m_inv_inertia = 1.0;
  (this->super_ChPhysicsItem).system = (other->super_ChPhysicsItem).system;
  dVar1 = other->pos;
  dVar2 = other->pos_dt;
  dVar3 = other->pos_dtdt;
  this->torque = other->torque;
  this->pos = dVar1;
  this->pos_dt = dVar2;
  this->pos_dtdt = dVar3;
  this->inertia = other->inertia;
  this->fixed = other->fixed;
  this->sleeping = other->sleeping;
  this->limitspeed = other->limitspeed;
  ChVariablesShaft::operator=(&this->variables,&other->variables);
  this->sleep_starttime = other->sleep_starttime;
  fVar4 = other->sleep_time;
  fVar5 = other->sleep_minspeed;
  fVar6 = other->sleep_minwvel;
  this->max_speed = other->max_speed;
  this->sleep_time = fVar4;
  this->sleep_minspeed = fVar5;
  this->sleep_minwvel = fVar6;
  return;
}

Assistant:

ChShaft::ChShaft(const ChShaft& other) : ChPhysicsItem(other) {
    torque = other.torque;
    system = other.system;
    pos = other.pos;
    pos_dt = other.pos_dt;
    pos_dtdt = other.pos_dtdt;
    inertia = other.inertia;
    fixed = other.fixed;
    sleeping = other.sleeping;
    limitspeed = other.limitspeed;

    variables = other.variables;

    max_speed = other.max_speed;

    sleep_time = other.sleep_time;
    sleep_starttime = other.sleep_starttime;
    sleep_minspeed = other.sleep_minspeed;
    sleep_minwvel = other.sleep_minwvel;
}